

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QHash<int,_QVariant>_>::relocate
          (QArrayDataPointer<QHash<int,_QVariant>_> *this,qsizetype offset,
          QHash<int,_QVariant> **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<QHash<int,_QVariant>_> *in_RDI;
  QHash<int,_QVariant> **unaff_retaddr;
  QHash<int,_QVariant> *res;
  QHash<int,_QVariant> *first;
  QArrayDataPointer<QHash<int,_QVariant>_> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QHash<int,QVariant>,long_long>
            (first,(longlong)in_RDI,(QHash<int,_QVariant> *)0x156437);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QHash<int,QVariant>>,QHash<int,QVariant>const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }